

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::DecodeDataBuilder::AddFirst
          (DecodeDataBuilder *this,char desired,char input)

{
  uint8_t uVar1;
  char cVar2;
  
  if (desired == input) {
    uVar1 = '\0';
  }
  else {
    cVar2 = input + -0x20;
    if (0x19 < (byte)(input + 0x9fU)) {
      cVar2 = input;
    }
    uVar1 = '@';
    if (cVar2 != desired) {
      if ((byte)(input + 0xbfU) < 0x1a) {
        input = input + ' ';
      }
      uVar1 = ' ';
      if (input != desired) {
        return false;
      }
    }
  }
  this->op_ = uVar1;
  this->segment_len_ = this->segment_len_ + 1;
  this->is_all_upper_ = (bool)(this->is_all_upper_ & (byte)(desired + 0xbfU) < 0x1a);
  return true;
}

Assistant:

bool AddFirst(const char desired, const char input) {
    if (desired == input) {
      op_ = kOpAsIs;
    } else if (desired == ascii_toupper(input)) {
      op_ = kOpFirstUpper;
    } else if (desired == ascii_tolower(input)) {
      op_ = kOpFirstLower;
    } else {
      // Can't be transformed to match.
      return false;
    }
    AddChar(desired);
    return true;
  }